

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

void __thiscall Matrix::Matrix(Matrix *this,int n,int m,int item)

{
  allocator<std::vector<Fraction,_std::allocator<Fraction>_>_> local_55 [20];
  allocator<Fraction> local_41;
  Fraction local_40;
  vector<Fraction,_std::allocator<Fraction>_> local_38;
  int local_1c;
  int local_18;
  int item_local;
  int m_local;
  int n_local;
  Matrix *this_local;
  
  this->n_ = n;
  this->m_ = m;
  local_1c = item;
  local_18 = m;
  item_local = n;
  _m_local = this;
  Fraction::Fraction(&local_40,item);
  std::allocator<Fraction>::allocator(&local_41);
  std::vector<Fraction,_std::allocator<Fraction>_>::vector(&local_38,(long)m,&local_40,&local_41);
  std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>::allocator(local_55);
  std::
  vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ::vector(&this->elements_,(long)n,&local_38,local_55);
  std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>::~allocator(local_55);
  std::vector<Fraction,_std::allocator<Fraction>_>::~vector(&local_38);
  std::allocator<Fraction>::~allocator(&local_41);
  return;
}

Assistant:

Matrix::Matrix(int n, int m, int item)
    : n_(n), m_(m),
      elements_(std::vector<std::vector<Fraction>>(n, std::vector<Fraction>(m, item))) {}